

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O1

DdNode * Extra_bddSpaceEquations(DdManager *dd,DdNode *bSpace)

{
  DdNode *n;
  DdNode *n_00;
  DdNode *n_01;
  
  do {
    dd->reordered = 0;
    n = extraBddSpaceEquationsPos(dd,bSpace);
  } while (dd->reordered == 1);
  Cudd_Ref(n);
  do {
    dd->reordered = 0;
    n_00 = extraBddSpaceEquationsNeg(dd,bSpace);
  } while (dd->reordered == 1);
  Cudd_Ref(n_00);
  n_01 = Cudd_zddUnion(dd,n,n_00);
  Cudd_Ref(n_01);
  Cudd_RecursiveDerefZdd(dd,n);
  Cudd_RecursiveDerefZdd(dd,n_00);
  Cudd_Deref(n_01);
  return n_01;
}

Assistant:

DdNode * Extra_bddSpaceEquations( DdManager * dd, DdNode * bSpace )
{
    DdNode * zRes;
    DdNode * zEquPos;
    DdNode * zEquNeg;
    zEquPos = Extra_bddSpaceEquationsPos( dd, bSpace );  Cudd_Ref( zEquPos );
    zEquNeg = Extra_bddSpaceEquationsNeg( dd, bSpace );  Cudd_Ref( zEquNeg );
    zRes    = Cudd_zddUnion( dd, zEquPos, zEquNeg );     Cudd_Ref( zRes );
    Cudd_RecursiveDerefZdd( dd, zEquPos );
    Cudd_RecursiveDerefZdd( dd, zEquNeg );
    Cudd_Deref( zRes );
    return zRes;
}